

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

COMMAND_QUEUE_TYPE Diligent::VkQueueFlagsToCmdQueueType(VkQueueFlags QueueFlags)

{
  COMMAND_QUEUE_TYPE local_11;
  VkQueueFlags local_10;
  COMMAND_QUEUE_TYPE Result;
  VkQueueFlags QueueFlags_local;
  
  local_11 = COMMAND_QUEUE_TYPE_UNKNOWN;
  local_10 = QueueFlags;
  if ((QueueFlags & 8) != 0) {
    operator|=(&local_11,COMMAND_QUEUE_TYPE_SPARSE_BINDING);
  }
  if ((local_10 & 1) == 0) {
    if ((local_10 & 2) == 0) {
      if ((local_10 & 4) == 0) {
        Result = COMMAND_QUEUE_TYPE_UNKNOWN;
      }
      else {
        Result = operator|(local_11,COMMAND_QUEUE_TYPE_TRANSFER);
      }
    }
    else {
      Result = operator|(local_11,COMMAND_QUEUE_TYPE_COMPUTE);
    }
  }
  else {
    Result = operator|(local_11,COMMAND_QUEUE_TYPE_GRAPHICS);
  }
  return Result;
}

Assistant:

COMMAND_QUEUE_TYPE VkQueueFlagsToCmdQueueType(VkQueueFlags QueueFlags)
{
    static_assert(COMMAND_QUEUE_TYPE_MAX_BIT == 0x7, "Please update the code below to handle the new context type");

    COMMAND_QUEUE_TYPE Result = COMMAND_QUEUE_TYPE_UNKNOWN;

    if (QueueFlags & VK_QUEUE_SPARSE_BINDING_BIT)
        Result |= COMMAND_QUEUE_TYPE_SPARSE_BINDING;

    if ((QueueFlags & VK_QUEUE_GRAPHICS_BIT) != 0)
        return Result | COMMAND_QUEUE_TYPE_GRAPHICS;

    if ((QueueFlags & VK_QUEUE_COMPUTE_BIT) != 0)
        return Result | COMMAND_QUEUE_TYPE_COMPUTE;

    if ((QueueFlags & VK_QUEUE_TRANSFER_BIT) != 0)
        return Result | COMMAND_QUEUE_TYPE_TRANSFER;

    return COMMAND_QUEUE_TYPE_UNKNOWN;
}